

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O3

optional<pbrt::LightLiSample> * __thiscall
pbrt::ImageInfiniteLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,ImageInfiniteLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  undefined8 uVar1;
  float fVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  float z;
  undefined1 auVar10 [16];
  undefined1 auVar13 [60];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  SampledSpectrum SVar18;
  Vector3f VVar19;
  float local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  Tuple2<pbrt::Point2,_float> local_28;
  undefined1 extraout_var [56];
  undefined1 auVar9 [56];
  undefined1 auVar14 [56];
  
  auVar5._8_56_ = in_register_00001208;
  auVar5._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  local_28 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar5._0_16_);
  auVar6._0_8_ = PiecewiseConstant2D::Sample
                           (&this->distribution + (mode == WithMIS),(Point2f *)&local_28,&local_6c);
  auVar6._8_56_ = extraout_var;
  auVar13 = ZEXT1260(SUB1612(ZEXT816(0) << 0x40,4));
  local_48 = auVar6._0_16_;
  if ((local_6c != 0.0) || (NAN(local_6c))) {
    auVar9 = extraout_var;
    VVar19 = EqualAreaSquareToSphere(auVar6._0_8_);
    auVar11._0_4_ = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar11._4_60_ = auVar13;
    auVar14 = auVar13._4_56_;
    auVar7._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = auVar9;
    auVar4 = auVar7._0_16_;
    auVar16 = vmovshdup_avx(auVar4);
    fVar15 = auVar16._0_4_;
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * (this->super_LightBase).renderFromLight.m.m[0]
                                                      [1])),auVar4,
                              ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]));
    auVar10 = auVar11._0_16_;
    local_68 = vfmadd231ss_fma(auVar16,auVar10,
                               ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * (this->super_LightBase).renderFromLight.m.m[1]
                                                      [1])),auVar4,
                              ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]));
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * (this->super_LightBase).renderFromLight.m.m[2]
                                                     [1])),auVar4,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]));
    local_58 = vfmadd231ss_fma(auVar16,auVar10,
                               ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
    auVar4 = vfmadd231ss_fma(auVar4,auVar10,
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
    local_38 = vinsertps_avx(local_68,local_58,0x10);
    auVar9 = ZEXT856((ulong)local_48._8_8_);
    SVar18 = Le(this,(Point2f)local_48._0_8_,&lambda);
    auVar12._0_8_ = SVar18.values.values._8_8_;
    auVar12._8_56_ = auVar14;
    auVar8._0_8_ = SVar18.values.values._0_8_;
    auVar8._8_56_ = auVar9;
    auVar16 = vmovlhps_avx(auVar8._0_16_,auVar12._0_16_);
    bVar3 = true;
    fVar15 = this->sceneRadius;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    fVar15 = fVar15 + fVar15;
    fVar2 = (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
            ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
            0.5 + auVar4._0_4_ * fVar15;
    auVar17._4_4_ = fVar2;
    auVar17._0_4_ = fVar2;
    auVar17._8_4_ = fVar2;
    auVar17._12_4_ = fVar2;
    *(undefined1 (*) [32])((long)&__return_storage_ptr__->optionalValue + 0x38) =
         ZEXT1232(ZEXT812(0));
    fVar2 = (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low +
            ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high) *
            0.5 + fVar15 * (float)local_68._0_4_;
    fVar15 = (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
             ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high)
             * 0.5 + fVar15 * (float)local_58._0_4_;
    *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar16;
    auVar16._4_4_ = fVar2;
    auVar16._0_4_ = fVar2;
    auVar16._8_4_ = fVar2;
    auVar16._12_4_ = fVar2;
    auVar10._4_4_ = fVar15;
    auVar10._0_4_ = fVar15;
    auVar10._8_4_ = fVar15;
    auVar10._12_4_ = fVar15;
    auVar16 = vmovlhps_avx(auVar16,auVar10);
    uVar1 = vmovlps_avx(local_38);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar1;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = auVar4._0_4_;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = local_6c / 12.566371;
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar16;
    uVar1 = vmovlps_avx(auVar17);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar1;
    *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
         &(this->super_LightBase).mediumInterface;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  }
  else {
    bVar3 = false;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  __return_storage_ptr__->set = bVar3;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<LightLiSample> SampleLi(LightSampleContext ctx, Point2f u,
                                           SampledWavelengths lambda,
                                           LightSamplingMode mode) const {
        // Find $(u,v)$ sample coordinates in infinite light texture
        Float mapPDF;
        Point2f uv = (mode == LightSamplingMode::WithMIS)
                         ? compensatedDistribution.Sample(u, &mapPDF)
                         : distribution.Sample(u, &mapPDF);
        if (mapPDF == 0)
            return {};

        // Convert infinite light sample point to direction
        Vector3f wl = EqualAreaSquareToSphere(uv);
        Vector3f wi = renderFromLight(wl);

        // Compute PDF for sampled infinite light direction
        Float pdf = mapPDF / (4 * Pi);

        // Return radiance value for infinite light direction
        return LightLiSample(
            Le(uv, lambda), wi, pdf,
            Interaction(ctx.p() + wi * (2 * sceneRadius), &mediumInterface));
    }